

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltalloc.cc
# Opt level: O3

void add_batch_to_central_cache(CentralCache *cc,uint sizeClass,FreeBlock *batch)

{
  if (0x12 < sizeClass) {
    batch->nextBatch = (FreeBlock *)cc->field_3;
    (cc->field_3).firstBatch = batch;
    return;
  }
  add_batch_to_central_cache();
  return;
}

Assistant:

static void add_batch_to_central_cache(CentralCache* cc, unsigned int sizeClass, FreeBlock* batch)
{
	if (!CHUNK_IS_SMALL)
	{
		batch->nextBatch = cc->firstBatch;
		cc->firstBatch = batch;
	}
	else
	{
		ChunkSm* cs = cc->chunkWithFreeBatches;
		if (unlikely(cs->numBatches == NUM_OF_BATCHES_IN_CHUNK_SM))
		{
			cs = cc->chunkWithFreeBatches = cc->chunkWithFreeBatches->next;
			LTALLOC_ASSERT(cs && cs->numBatches == 0);
		}
		cs->batches[cs->numBatches++] = batch;
	}
}